

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void small_alloc_test(int size_min,int size_max,int objects_max,int oscillation_max,
                     int iterations_max)

{
  int iVar1;
  int iVar2;
  int local_34;
  int pos_1;
  int pos;
  int j;
  int oscillation;
  int i;
  float actual_alloc_factor;
  int iterations_max_local;
  int oscillation_max_local;
  int objects_max_local;
  int size_max_local;
  int size_min_local;
  
  i = iterations_max;
  actual_alloc_factor = (float)oscillation_max;
  iterations_max_local = objects_max;
  oscillation_max_local = size_max;
  objects_max_local = size_min;
  small_alloc_create(&alloc,&cache,0xc,8,1.3,(float *)&oscillation);
  for (j = 0; j < i; j = j + 1) {
    iVar1 = rand();
    iVar1 = iVar1 % (int)actual_alloc_factor;
    for (pos_1 = 0; pos_1 < iVar1; pos_1 = pos_1 + 1) {
      iVar2 = rand();
      alloc_checked(iVar2 % iterations_max_local,objects_max_local,oscillation_max_local);
    }
    allocating = (_Bool)((allocating ^ 0xffU) & 1);
  }
  for (local_34 = 0; local_34 < 1000; local_34 = local_34 + 1) {
    if (ptrs[local_34] != (int *)0x0) {
      free_checked(ptrs[local_34]);
    }
  }
  small_check_unused();
  small_alloc_destroy(&alloc);
  return;
}

Assistant:

static void
small_alloc_test(int size_min, int size_max, int objects_max,
		 int oscillation_max, int iterations_max)
{
	float actual_alloc_factor;
	small_alloc_create(&alloc, &cache, OBJSIZE_MIN,
			   sizeof(intptr_t), 1.3,
			   &actual_alloc_factor);

	for (int i = 0; i < iterations_max; i++) {
		int oscillation = rand() % oscillation_max;
		for (int j = 0; j < oscillation; ++j) {
			int pos = rand() % objects_max;
			alloc_checked(pos, size_min, size_max);
		}
		allocating = ! allocating;
	}

	for (int pos = 0; pos < OBJECTS_MAX; pos++) {
		if (ptrs[pos] != NULL)
			free_checked(ptrs[pos]);
	}

	small_check_unused();

	small_alloc_destroy(&alloc);
}